

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Cleanup(AdvancedChangeSize *this)

{
  int local_14;
  int i;
  AdvancedChangeSize *this_local;
  
  glu::CallLogWrapper::glDeleteProgramPipelines
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_pipeline);
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[local_14]);
  }
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_texture);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgramPipelines(1, &m_pipeline);
		for (int i = 0; i < 2; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteTextures(2, m_texture);
		return NO_ERROR;
	}